

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<unsigned_int>::relocate
          (QArrayDataPointer<unsigned_int> *this,qsizetype offset,uint **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<unsigned_int> *in_RDI;
  uint **unaff_retaddr;
  uint *res;
  uint *first;
  QArrayDataPointer<unsigned_int> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<unsigned_int,long_long>(first,(longlong)in_RDI,(uint *)0x2e2de7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<unsigned_int>,unsigned_int_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 4 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }